

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.hpp
# Opt level: O0

void __thiscall helics::CloneOperator::~CloneOperator(CloneOperator *this)

{
  CloneOperator *in_RDI;
  
  ~CloneOperator(in_RDI);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

class HELICS_CXX_EXPORT CloneOperator: public FilterOperator {
  public:
    /** default constructor*/
    CloneOperator() = default;
    /** set the function to modify the data of the message in the constructor*/
    explicit CloneOperator(
        std::function<std::vector<std::unique_ptr<Message>>(const Message*)> userCloneFunction);
    /** set the function to modify the data of the message*/
    void setCloneFunction(
        std::function<std::vector<std::unique_ptr<Message>>(const Message*)> userCloneFunction);
    virtual bool isMessageGenerating() const override { return true; }

  private:
    std::function<std::vector<std::unique_ptr<Message>>(const Message*)>
        evalFunction;  //!< the function actually doing the processing
    virtual std::unique_ptr<Message> process(std::unique_ptr<Message> message) override;
    virtual std::vector<std::unique_ptr<Message>>
        processVector(std::unique_ptr<Message> message) override;
}